

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

bool __thiscall wirehair::Codec::IsAllOriginalData(Codec *this)

{
  uint uVar1;
  uint8_t *__s;
  ushort uVar2;
  PeelRow *pPVar3;
  ushort uVar4;
  uint uVar5;
  
  __s = this->_recovery_blocks;
  uVar5 = 0;
  memset(__s,0,(ulong)this->_block_count);
  uVar2 = this->_row_count;
  if (uVar2 != 0) {
    pPVar3 = this->_peel_rows;
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar1 = pPVar3->RecoveryId;
      if ((uVar1 < this->_block_count) && (__s[uVar1] == '\0')) {
        __s[uVar1] = '\x01';
        uVar5 = uVar5 + 1;
        uVar2 = this->_row_count;
      }
      uVar4 = uVar4 + 1;
      pPVar3 = pPVar3 + 1;
    } while (uVar4 < uVar2);
  }
  return this->_block_count <= uVar5;
}

Assistant:

bool Codec::IsAllOriginalData()
{
    // Use some of the recovery blocks memory
    uint8_t * GF256_RESTRICT copied_rows = reinterpret_cast<uint8_t*>(_recovery_blocks);

    // Zero an array to store whether or not each row id needs to be regenerated
    memset(copied_rows, 0, _block_count);

    const PeelRow * GF256_RESTRICT row = _peel_rows;
    unsigned seen_rows = 0;

    // Copy any original message rows that were received:
    for (uint16_t row_i = 0; row_i < _row_count; ++row_i, ++row)
    {
        const uint32_t id = row->RecoveryId;

        // If the row identifier indicates it is part of the original message data:
        // If not already marked copied:
        if (id < _block_count &&
            !copied_rows[id])
        {
            copied_rows[id] = 1;
            ++seen_rows;
        }
    }

    // If all rows were seen, return true
    return seen_rows >= _block_count;
}